

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

bool __thiscall kj::_::XThreadFulfiller<int>::isWaiting(XThreadFulfiller<int> *this)

{
  if (this->target != (XThreadPaf *)0x0) {
    return this->target->state == WAITING;
  }
  return false;
}

Assistant:

bool isWaiting() const override {
    KJ_IF_SOME(t, target) {
#if _MSC_VER && !__clang__
      // Just assume 1-byte loads are atomic... on what kind of absurd platform would they not be?
      return t.state == XThreadPaf::WAITING;
#else
      return __atomic_load_n(&t.state, __ATOMIC_RELAXED) == XThreadPaf::WAITING;
#endif
    } else {
      return false;
    }
  }